

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

void init_adf_data(warm_cb *data,size_t num_actions)

{
  multi_ex *this;
  pointer *ppfVar1;
  iterator __position;
  ulong uVar2;
  example *peVar3;
  label *plVar4;
  label *plVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  wclass local_40;
  
  data->num_actions = (uint32_t)num_actions;
  data->ws_type = data->sim_bandit + 1;
  this = &data->ecs;
  std::vector<example_*,_std::allocator<example_*>_>::resize(this,num_actions);
  if (num_actions == 0) {
    plVar4 = calloc_or_throw<COST_SENSITIVE::label>(0);
    data->csls = plVar4;
  }
  else {
    sVar8 = 0;
    do {
      peVar3 = VW::alloc_examples(DAT_002dab08,1);
      (this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar8] = peVar3;
      (*(code *)CB::cb_label)
                (&(this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[sVar8]->l);
      sVar8 = sVar8 + 1;
    } while (num_actions != sVar8);
    plVar4 = calloc_or_throw<COST_SENSITIVE::label>(num_actions);
    data->csls = plVar4;
    uVar2 = 1;
    uVar9 = 0;
    do {
      uVar7 = uVar2;
      (*(code *)COST_SENSITIVE::cs_label)(data->csls + uVar9);
      local_40.x = 0.0;
      local_40.partial_prediction = 0.0;
      local_40.wap_value = 0.0;
      local_40.class_index = (uint32_t)uVar7;
      v_array<COST_SENSITIVE::wclass>::push_back(&data->csls[uVar9].costs,&local_40);
      uVar2 = (ulong)((uint32_t)uVar7 + 1);
      uVar9 = uVar7;
    } while (uVar7 < num_actions);
  }
  plVar5 = calloc_or_throw<CB::label>(num_actions);
  data->cbls = plVar5;
  data->ws_train_size = data->ws_period;
  data->ws_vali_size = 0;
  data->ws_iter = 0;
  data->inter_iter = 0;
  setup_lambdas(data);
  if (data->choices_lambda != 0) {
    uVar6 = 0;
    do {
      local_40.x = 0.0;
      __position._M_current =
           (data->cumulative_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->cumulative_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&data->cumulative_costs,__position,&local_40.x);
      }
      else {
        *__position._M_current = 0.0;
        ppfVar1 = &(data->cumulative_costs).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < data->choices_lambda);
  }
  data->cumu_var = 0.0;
  return;
}

Assistant:

void init_adf_data(warm_cb& data, const size_t num_actions)
{
  data.num_actions = num_actions;
  if (data.sim_bandit)
    data.ws_type = BANDIT_WS;
  else
    data.ws_type = SUPERVISED_WS;
  data.ecs.resize(num_actions);
  for (size_t a=0; a < num_actions; ++a)
  {
    data.ecs[a] = VW::alloc_examples(CB::cb_label.label_size, 1);
    auto& lab = data.ecs[a]->l.cb;
    CB::cb_label.default_label(&lab);
  }

	// The rest of the initialization is for warm start CB
	data.csls = calloc_or_throw<COST_SENSITIVE::label>(num_actions);
	for (uint32_t a=0; a < num_actions; ++a)
	{
		COST_SENSITIVE::cs_label.default_label(&data.csls[a]);
		data.csls[a].costs.push_back({0, a+1, 0, 0});
	}
	data.cbls = calloc_or_throw<CB::label>(num_actions);

	data.ws_train_size = data.ws_period;
	data.ws_vali_size = 0;

	data.ws_iter = 0;
	data.inter_iter = 0;

	setup_lambdas(data);
	for (uint32_t i = 0; i < data.choices_lambda; i++)
		data.cumulative_costs.push_back(0.f);
	data.cumu_var = 0.f;
}